

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::BeamData::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,BeamData *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"BeamData:");
  poVar1 = std::operator<<(poVar1,"\n\tAzimuth Center:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32AziCtr);
  poVar1 = std::operator<<(poVar1,"\n\tAzimuth Sweep:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32AziSwp);
  poVar1 = std::operator<<(poVar1,"\n\tElevation Center:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32EleCtr);
  poVar1 = std::operator<<(poVar1,"\n\tElevation Sweep:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32EleSwp);
  poVar1 = std::operator<<(poVar1,"\n\tBeam Sweep Sync:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32SwpSyn);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString BeamData::GetAsString() const
{
    KStringStream ss;

    ss << "BeamData:"
       << "\n\tAzimuth Center:    " << m_f32AziCtr
       << "\n\tAzimuth Sweep:     " << m_f32AziSwp
       << "\n\tElevation Center:  " << m_f32EleCtr
       << "\n\tElevation Sweep:   " << m_f32EleSwp
       << "\n\tBeam Sweep Sync:   " << m_f32SwpSyn
       << "\n";

    return ss.str();
}